

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr ** __thiscall
QtPrivate::QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::createHole
          (QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *this,
          GrowthPosition pos,qsizetype where,qsizetype n)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **insertionPoint;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **local_28;
  
  local_28 = (_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **)
             (*(long *)(in_RDI + 8) + in_RDX * 8);
  if (in_ESI == 0) {
    if (in_RDX < *(long *)(in_RDI + 0x10)) {
      memmove(local_28 + in_RCX,local_28,(*(long *)(in_RDI + 0x10) - in_RDX) * 8);
    }
  }
  else {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + in_RCX * -8;
    local_28 = local_28 + -in_RCX;
  }
  *(long *)(in_RDI + 0x10) = in_RCX + *(long *)(in_RDI + 0x10);
  return local_28;
}

Assistant:

T *createHole(QArrayData::GrowthPosition pos, qsizetype where, qsizetype n)
    {
        Q_ASSERT((pos == QArrayData::GrowsAtBeginning && n <= this->freeSpaceAtBegin()) ||
                 (pos == QArrayData::GrowsAtEnd && n <= this->freeSpaceAtEnd()));

        T *insertionPoint = this->ptr + where;
        if (pos == QArrayData::GrowsAtEnd) {
            if (where < this->size)
                ::memmove(static_cast<void *>(insertionPoint + n), static_cast<void *>(insertionPoint), (this->size - where) * sizeof(T));
        } else {
            Q_ASSERT(where == 0);
            this->ptr -= n;
            insertionPoint -= n;
        }
        this->size += n;
        return insertionPoint;
    }